

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void pstack::print_container<std::vector<unsigned_char,std::allocator<unsigned_char>>,char_const&>
               (ostream *os,undefined8 *container)

{
  byte *pbVar1;
  size_t sVar2;
  char *__s;
  uchar *field;
  byte *pbVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  pbVar3 = (byte *)*container;
  pbVar1 = (byte *)container[1];
  if (pbVar3 != pbVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      std::ostream::operator<<(os,(uint)*pbVar3);
      pbVar3 = pbVar3 + 1;
      __s = ",\n";
    } while (pbVar3 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}